

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Token * __thiscall
toml::internal::Lexer::parseAsTime(Token *__return_storage_ptr__,Lexer *this,string *str)

{
  char cVar1;
  int iVar2;
  time_t tVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  pointer pcVar7;
  long lVar8;
  double dVar9;
  char pn;
  int n;
  tm t;
  int DD;
  int MM;
  int YYYY;
  double ss;
  int om;
  int oh;
  int mm;
  int hh;
  char local_a5;
  int local_a4;
  tm local_a0;
  int local_64;
  int local_60;
  int local_5c;
  long *local_58;
  long local_50;
  long local_48 [2];
  double local_38;
  int local_30;
  int local_2c;
  undefined4 local_28;
  int local_24;
  
  pcVar7 = (str->_M_dataplus)._M_p;
  iVar2 = __isoc99_sscanf(pcVar7,"%d-%d-%d%n",&local_5c,&local_60,&local_64,&local_a4);
  if (iVar2 == 3) {
    if (local_60 - 1U < 0xc) {
      if (local_5c < 0x76c) {
        local_a0._0_8_ = &local_a0.tm_mon;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Invalid token","");
        __return_storage_ptr__->type_ = ERROR_TOKEN;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_a0._0_8_,
                   CONCAT44(local_a0.tm_mday,local_a0.tm_hour) + local_a0._0_8_);
      }
      else if (pcVar7[local_a4] == 'T') {
        pcVar7 = pcVar7 + (long)local_a4 + 1;
        iVar2 = __isoc99_sscanf(pcVar7,"%d:%d:%lf%n",&local_24,&local_28,&local_38,&local_a4);
        if (iVar2 == 3) {
          local_a0.tm_min = local_28;
          local_a0.tm_sec = (int)local_38;
          local_a0.tm_hour = local_24;
          local_a0.tm_mday = local_64;
          local_a0.tm_mon = local_60 + -1;
          local_a0.tm_year = local_5c + -0x76c;
          tVar3 = timegm(&local_a0);
          local_38 = local_38 - (double)(int)local_38;
          dVar9 = round(local_38 * 1000000.0);
          lVar8 = (long)dVar9 * 1000 + tVar3 * 1000000000;
          cVar1 = pcVar7[local_a4];
          if (cVar1 == 'Z') {
            cVar1 = (pcVar7 + local_a4)[1];
          }
          if (cVar1 == '\0') {
            __return_storage_ptr__->type_ = TIME;
            (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->str_value_).field_2;
            (__return_storage_ptr__->str_value_)._M_string_length = 0;
            (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->time_value_).__d.__r = lVar8;
            return __return_storage_ptr__;
          }
          iVar2 = __isoc99_sscanf(pcVar7 + local_a4,"%c%d:%d",&local_a5,&local_2c,&local_30);
          if (iVar2 == 3) {
            if (local_a5 == '+') {
              lVar4 = -60000000000;
              lVar5 = -3600000000000;
LAB_00134348:
              __return_storage_ptr__->type_ = TIME;
              (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->str_value_).field_2;
              (__return_storage_ptr__->str_value_)._M_string_length = 0;
              (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->time_value_).__d.__r =
                   local_30 * lVar4 + local_2c * lVar5 + lVar8;
              return __return_storage_ptr__;
            }
            if (local_a5 == '-') {
              lVar4 = 60000000000;
              lVar5 = 3600000000000;
              goto LAB_00134348;
            }
            local_58 = local_48;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Invalid token","");
            __return_storage_ptr__->type_ = ERROR_TOKEN;
            (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->str_value_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->str_value_,local_58,
                       local_50 + (long)local_58);
          }
          else {
            local_58 = local_48;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Invalid token","");
            __return_storage_ptr__->type_ = ERROR_TOKEN;
            (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->str_value_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->str_value_,local_58,
                       local_50 + (long)local_58);
          }
          (__return_storage_ptr__->time_value_).__d.__r = 0;
          plVar6 = local_58;
          if (local_58 == local_48) {
            return __return_storage_ptr__;
          }
          goto LAB_0013408a;
        }
        local_a0._0_8_ = &local_a0.tm_mon;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Invalid token","");
        __return_storage_ptr__->type_ = ERROR_TOKEN;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_a0._0_8_,
                   CONCAT44(local_a0.tm_mday,local_a0.tm_hour) + local_a0._0_8_);
      }
      else {
        if (pcVar7[local_a4] == '\0') {
          local_a0.tm_sec = 0;
          local_a0.tm_min = 0;
          local_a0.tm_hour = 0;
          local_a0.tm_mday = local_64;
          local_a0.tm_year = local_5c + -0x76c;
          local_a0.tm_mon = local_60 - 1U;
          tVar3 = timegm(&local_a0);
          __return_storage_ptr__->type_ = TIME;
          (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->str_value_).field_2;
          (__return_storage_ptr__->str_value_)._M_string_length = 0;
          (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->time_value_).__d.__r = tVar3 * 1000000000;
          return __return_storage_ptr__;
        }
        local_a0._0_8_ = &local_a0.tm_mon;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Invalid token","");
        __return_storage_ptr__->type_ = ERROR_TOKEN;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_a0._0_8_,
                   CONCAT44(local_a0.tm_mday,local_a0.tm_hour) + local_a0._0_8_);
      }
    }
    else {
      local_a0._0_8_ = &local_a0.tm_mon;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Invalid token","");
      __return_storage_ptr__->type_ = ERROR_TOKEN;
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->str_value_,local_a0._0_8_,
                 CONCAT44(local_a0.tm_mday,local_a0.tm_hour) + local_a0._0_8_);
    }
  }
  else {
    local_a0._0_8_ = &local_a0.tm_mon;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Invalid token","");
    __return_storage_ptr__->type_ = ERROR_TOKEN;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_a0._0_8_,
               CONCAT44(local_a0.tm_mday,local_a0.tm_hour) + local_a0._0_8_);
  }
  (__return_storage_ptr__->time_value_).__d.__r = 0;
  if ((int *)local_a0._0_8_ == &local_a0.tm_mon) {
    return __return_storage_ptr__;
  }
  local_48[0] = CONCAT44(local_a0.tm_year,local_a0.tm_mon);
  plVar6 = (long *)local_a0._0_8_;
LAB_0013408a:
  operator_delete(plVar6,local_48[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

inline Token Lexer::parseAsTime(const std::string& str)
{
    const char* s = str.c_str();

    int n;
    int YYYY, MM, DD;
#if defined(_MSC_VER)
    if (sscanf_s(s, "%d-%d-%d%n", &YYYY, &MM, &DD, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%d-%d-%d%n", &YYYY, &MM, &DD, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    if (!(1 <= MM && MM <= 12)) {
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
    }
    if (YYYY < 1900) {
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
    }

    if (s[n] == '\0') {
        std::tm t;
        t.tm_sec = 0;
        t.tm_min = 0;
        t.tm_hour = 0;
        t.tm_mday = DD;
        t.tm_mon = MM - 1;
        t.tm_year = YYYY - 1900;
        auto tp = std::chrono::system_clock::from_time_t(timegm(&t));
        return Token(TokenType::TIME, tp);
    }

    if (s[n] != 'T')
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));

    s = s + n + 1;

    int hh, mm;
    double ss; // double for fraction
#if defined(_MSC_VER)
    if (sscanf_s(s, "%d:%d:%lf%n", &hh, &mm, &ss, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%d:%d:%lf%n", &hh, &mm, &ss, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    std::tm t;
    t.tm_sec = static_cast<int>(ss);
    t.tm_min = mm;
    t.tm_hour = hh;
    t.tm_mday = DD;
    t.tm_mon = MM - 1;
    t.tm_year = YYYY - 1900;
    auto tp = std::chrono::system_clock::from_time_t(timegm(&t));
    ss -= static_cast<int>(ss);
    // TODO(mayah): workaround GCC 4.9.3 on cygwin does not have std::round, but round().
    tp += std::chrono::microseconds(static_cast<std::int64_t>(round(ss * 1000000)));

    if (s[n] == '\0')
        return Token(TokenType::TIME, tp);

    if (s[n] == 'Z' && s[n + 1] == '\0')
        return Token(TokenType::TIME, tp);

    s = s + n;
    // offset
    // [+/-]%d:%d
    char pn;
    int oh, om;
#if defined(_MSC_VER)
    if (sscanf_s(s, "%c%d:%d", &pn, static_cast<unsigned>(sizeof(pn)), &oh, &om) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%c%d:%d", &pn, &oh, &om) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    if (pn != '+' && pn != '-')
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));

    if (pn == '+') {
        tp -= std::chrono::hours(oh);
        tp -= std::chrono::minutes(om);
    } else {
        tp += std::chrono::hours(oh);
        tp += std::chrono::minutes(om);
    }

    return Token(TokenType::TIME, tp);
}